

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Range.cpp
# Opt level: O2

void __thiscall Range::each(Range *this,function<void_(const_CylHead_&)> *func,bool cyls_first)

{
  undefined7 in_register_00000011;
  int head;
  int iVar1;
  int iVar2;
  CylHead local_30;
  
  if ((int)CONCAT71(in_register_00000011,cyls_first) != 0) {
    iVar1 = this->head_begin;
    iVar2 = this->head_end;
    if (1 < iVar2 - iVar1) {
      for (; iVar1 < iVar2; iVar1 = iVar1 + 1) {
        for (iVar2 = this->cyl_begin; iVar2 < this->cyl_end; iVar2 = iVar2 + 1) {
          CylHead::CylHead(&local_30,iVar2,iVar1);
          std::function<void_(const_CylHead_&)>::operator()(func,&local_30);
        }
        iVar2 = this->head_end;
      }
      return;
    }
  }
  for (iVar1 = this->cyl_begin; iVar1 < this->cyl_end; iVar1 = iVar1 + 1) {
    for (iVar2 = this->head_begin; iVar2 < this->head_end; iVar2 = iVar2 + 1) {
      CylHead::CylHead(&local_30,iVar1,iVar2);
      std::function<void_(const_CylHead_&)>::operator()(func,&local_30);
    }
  }
  return;
}

Assistant:

void Range::each(const std::function<void(const CylHead & cylhead)>& func, bool cyls_first/*=false*/) const
{
    if (cyls_first && heads() > 1)
    {
        for (auto head = head_begin; head < head_end; ++head)
            for (auto cyl = cyl_begin; cyl < cyl_end; ++cyl)
                func(CylHead(cyl, head));
    }
    else
    {
        for (auto cyl = cyl_begin; cyl < cyl_end; ++cyl)
            for (auto head = head_begin; head < head_end; ++head)
                func(CylHead(cyl, head));
    }
}